

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,bool deterministic,uint8 *target)

{
  int iVar1;
  string *psVar2;
  char *data;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  uint8 *puVar7;
  uint uVar8;
  int index;
  byte *pbVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  
  if (0 < (this->path_).current_size_) {
    *target = '\n';
    pbVar9 = target + 1;
    uVar8 = this->_path_cached_byte_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar9 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar5;
    target = internal::WireFormatLite::WriteInt32NoTagToArray(&this->path_,pbVar9 + 1);
  }
  if (0 < (this->span_).current_size_) {
    *target = '\x12';
    pbVar9 = target + 1;
    uVar8 = this->_span_cached_byte_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar9 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar5;
    target = internal::WireFormatLite::WriteInt32NoTagToArray(&this->span_,pbVar9 + 1);
  }
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    psVar2 = (this->leading_comments_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.leading_comments");
    psVar2 = (this->leading_comments_).ptr_;
    *target = '\x1a';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar8 & 2) != 0) {
    psVar2 = (this->trailing_comments_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    psVar2 = (this->trailing_comments_).ptr_;
    *target = '\"';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->leading_detached_comments_;
    index = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      data = (pTVar6->_M_dataplus)._M_p;
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar6->_M_string_length,SERIALIZE,
                 "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      *target = '2';
      target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar6,target + 1);
      index = index + 1;
    } while (iVar1 != index);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar7 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _path_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->path_, target);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      2,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _span_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->span_, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->trailing_comments(), target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_detached_comments(i).data(), this->leading_detached_comments(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(6, this->leading_detached_comments(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}